

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::retrain(FastText *this,Args *args)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Model *this_00;
  pointer plVar2;
  pointer plVar3;
  undefined1 local_3d;
  int local_3c;
  vector<long,_std::allocator<long>_> local_38;
  
  local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Args,std::allocator<fasttext::Args>,fasttext::Args_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish,(Args **)&local_38,
             (allocator<fasttext::Args> *)&local_3c,args);
  plVar3 = local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  plVar2 = local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  p_Var1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar2;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
     local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
     _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
      == sup) {
    local_3c = Dictionary::nlabels((this->dict_).
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
    local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,int,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish,(Matrix **)&local_38,
               (allocator<fasttext::Matrix> *)&local_3d,&local_3c,
               &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->dim);
    plVar3 = local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    plVar2 = local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    p_Var1 = (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)plVar2;
    (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3;
    if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00120eb7;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  else {
    local_3c = Dictionary::nwords((this->dict_).
                                  super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
    local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,int,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish,(Matrix **)&local_38,
               (allocator<fasttext::Matrix> *)&local_3d,&local_3c,
               &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->dim);
    plVar3 = local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    plVar2 = local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    p_Var1 = (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)plVar2;
    (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3;
    if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00120eb7;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
LAB_00120eb7:
  Matrix::zero((this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  startThreads(this);
  local_3c = 0;
  local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Model,std::allocator<fasttext::Model>,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish,(Model **)&local_38,
             (allocator<fasttext::Model> *)&local_3d,&this->input_,&this->output_,&this->weights_,
             &this->args_,&local_3c);
  plVar3 = local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  plVar2 = local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  p_Var1 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar2;
  (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
     local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
     _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  this_00 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
      == sup) {
    Dictionary::getCounts
              (&local_38,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,label);
    Model::setTargetCounts(this_00,&local_38);
  }
  else {
    Dictionary::getCounts
              (&local_38,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,word);
    Model::setTargetCounts(this_00,&local_38);
  }
  if (local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FastText::retrain(const Args& args)
{	
	args_ = std::make_shared<Args>(args);
	if (args_->model == model_name::sup) {
		output_ = std::make_shared<Matrix>(dict_->nlabels(), args_->dim);
	} else {
		output_ = std::make_shared<Matrix>(dict_->nwords(), args_->dim);
	}
	output_->zero();
	startThreads();
	model_ = std::make_shared<Model>(input_, output_, weights_, args_, 0);
	if (args_->model == model_name::sup) {
		model_->setTargetCounts(dict_->getCounts(entry_type::label));
	} else {
		model_->setTargetCounts(dict_->getCounts(entry_type::word));
	}
}